

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::XML_CheckNode_MustHaveChildren(AMFImporter *this)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar1 == '\0') {
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_78,"Node <",&local_79);
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator+(&local_58,&local_78,(char *)CONCAT44(extraout_var,iVar1));
  std::operator+(&local_38,&local_58,"> must have children.");
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::XML_CheckNode_MustHaveChildren()
{
	if(mReader->isEmptyElement()) throw DeadlyImportError(std::string("Node <") + mReader->getNodeName() + "> must have children.");
}